

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::select<float,4>
          (tcu *this,Vector<float,_4> *trueVal,Vector<float,_4> *falseVal,Vector<bool,_4> *cond)

{
  int i;
  long lVar1;
  float *pfVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    pfVar2 = trueVal->m_data;
    if (cond->m_data[lVar1] == false) {
      pfVar2 = falseVal->m_data;
    }
    uVar3 = (ulong)(uint)*pfVar2;
    *(float *)(this + lVar1 * 4) = *pfVar2;
    falseVal = (Vector<float,_4> *)((long)falseVal + 4);
    trueVal = (Vector<float,_4> *)((long)trueVal + 4);
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}